

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_extension.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  string *psVar1;
  int iVar2;
  pointer pcVar3;
  FieldDescriptor *pFVar4;
  undefined1 in_CL;
  string local_50;
  
  this->descriptor_ = descriptor;
  psVar1 = &this->type_traits_;
  (this->type_traits_)._M_dataplus._M_p = (pointer)&(this->type_traits_).field_2;
  (this->type_traits_)._M_string_length = 0;
  (this->type_traits_).field_2._M_local_buf[0] = '\0';
  (this->options_).dllexport_decl._M_dataplus._M_p =
       (pointer)&(this->options_).dllexport_decl.field_2;
  pcVar3 = (options->dllexport_decl)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->options_,pcVar3,pcVar3 + (options->dllexport_decl)._M_string_length);
  (this->options_).safe_boundary_check = options->safe_boundary_check;
  pFVar4 = this->descriptor_;
  if (*(int *)(pFVar4 + 0x30) == 3) {
    in_CL = 0x36;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->type_traits_)._M_string_length,0x230236);
    pFVar4 = this->descriptor_;
  }
  iVar2 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar4 + 0x2c) * 4);
  if (iVar2 == 10) {
    std::__cxx11::string::append((char *)psVar1);
    ClassName_abi_cxx11_
              (&local_50,*(cxx **)(this->descriptor_ + 0x48),(Descriptor *)0x1,(bool)in_CL);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else if (iVar2 != 9) {
    if (iVar2 == 8) {
      std::__cxx11::string::append((char *)psVar1);
      ClassName_abi_cxx11_
                (&local_50,*(cxx **)(this->descriptor_ + 0x50),(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)psVar1);
      ClassName_abi_cxx11_
                (&local_50,*(cxx **)(this->descriptor_ + 0x50),(EnumDescriptor *)0x1,(bool)in_CL);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::append((char *)psVar1);
      PrimitiveTypeName(*(CppType *)
                         (FieldDescriptor::kTypeToCppTypeMap +
                         (ulong)*(uint *)(this->descriptor_ + 0x2c) * 4));
      std::__cxx11::string::append((char *)psVar1);
    }
  }
  std::__cxx11::string::append((char *)psVar1);
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor,
                                       const Options& options)
  : descriptor_(descriptor),
    options_(options) {
  // Construct type_traits_.
  if (descriptor_->is_repeated()) {
    type_traits_ = "Repeated";
  }

  switch (descriptor_->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      type_traits_.append("EnumTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append(", ");
      type_traits_.append(ClassName(descriptor_->enum_type(), true));
      type_traits_.append("_IsValid>");
      break;
    case FieldDescriptor::CPPTYPE_STRING:
      type_traits_.append("StringTypeTraits");
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      type_traits_.append("MessageTypeTraits< ");
      type_traits_.append(ClassName(descriptor_->message_type(), true));
      type_traits_.append(" >");
      break;
    default:
      type_traits_.append("PrimitiveTypeTraits< ");
      type_traits_.append(PrimitiveTypeName(descriptor_->cpp_type()));
      type_traits_.append(" >");
      break;
  }
}